

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * Path::strip_whitespace(string *__return_storage_ptr__,string *str)

{
  string local_68 [32];
  undefined4 local_48;
  allocator local_41;
  long local_40;
  size_type index;
  string ret;
  string *str_local;
  
  ret.field_2._8_8_ = str;
  std::__cxx11::string::string((string *)&index);
  local_40 = std::__cxx11::string::find_first_not_of((char *)ret.field_2._8_8_,0x1f84e6);
  if (local_40 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    std::__cxx11::string::substr((ulong)local_68,ret.field_2._8_8_);
    std::__cxx11::string::operator=((string *)&index,local_68);
    std::__cxx11::string::~string(local_68);
    local_40 = std::__cxx11::string::find_last_not_of((char *)&index,0x1f84e6);
    if (local_40 == -1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&index);
    }
    else {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&index);
    }
  }
  local_48 = 1;
  std::__cxx11::string::~string((string *)&index);
  return __return_storage_ptr__;
}

Assistant:

string strip_whitespace(const string &str)
{
	string ret;
	auto index = str.find_first_not_of(" \t");
	if (index == string::npos)
		return "";
	ret = str.substr(index, string::npos);
	index = ret.find_last_not_of(" \t");
	if (index != string::npos)
		return ret.substr(0, index + 1);
	else
		return ret;
}